

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * __thiscall duckdb_re2::Regexp::Incref(Regexp *this)

{
  mapped_type_conflict3 *pmVar1;
  Regexp *in_RDI;
  MutexLock l;
  Mutex *in_stack_ffffffffffffff98;
  MutexLock *in_stack_ffffffffffffffa0;
  once_flag *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffd8;
  map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
  *in_stack_ffffffffffffffe0;
  Regexp *local_8;
  
  if (in_RDI->ref_ < 0xfffe) {
    in_RDI->ref_ = in_RDI->ref_ + 1;
    local_8 = in_RDI;
  }
  else {
    std::call_once<duckdb_re2::Regexp::Incref()::__0>
              (in_stack_ffffffffffffffc0,(anon_class_1_0_00000001 *)in_RDI);
    ref_mutex();
    MutexLock::MutexLock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (in_RDI->ref_ == 0xffff) {
      ref_map();
      pmVar1 = std::
               map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
               ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      *pmVar1 = *pmVar1 + 1;
    }
    else {
      ref_map();
      pmVar1 = std::
               map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
               ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      *pmVar1 = 0xffff;
      in_RDI->ref_ = 0xffff;
    }
    MutexLock::~MutexLock((MutexLock *)0x80538d);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

Regexp* Regexp::Incref() {
  if (ref_ >= kMaxRef-1) {
    static std::once_flag ref_once;
    std::call_once(ref_once, []() {
      (void) new (ref_storage) RefStorage;
    });

    // Store ref count in overflow map.
    MutexLock l(ref_mutex());
    if (ref_ == kMaxRef) {
      // already overflowed
      (*ref_map())[this]++;
    } else {
      // overflowing now
      (*ref_map())[this] = kMaxRef;
      ref_ = kMaxRef;
    }
    return this;
  }

  ref_++;
  return this;
}